

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::writeWithIndent(BuiltStyledStreamWriter *this,string *value)

{
  if ((this->field_0xd8 & 2) == 0) {
    writeIndent(this);
  }
  std::operator<<((this->super_StreamWriter).sout_,(string *)value);
  this->field_0xd8 = this->field_0xd8 & 0xfd;
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeWithIndent(std::string const& value) {
  if (!indented_) writeIndent();
  *sout_ << value;
  indented_ = false;
}